

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAgglomerateEl.cpp
# Opt level: O0

void __thiscall
TPZAgglomerateElement::CreateGraphicalElement
          (TPZAgglomerateElement *this,TPZGraphMesh *grmesh,int dimension)

{
  bool bVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  TPZGraphElQ2dd *this_00;
  TPZCompEl *c;
  int in_EDX;
  long *in_RDI;
  bool to_postpro;
  int nsides;
  int matid;
  TPZAgglomerateElement *in_stack_ffffffffffffffa8;
  TPZGraphMesh *in_stack_ffffffffffffffb0;
  TPZCompEl *in_stack_ffffffffffffffb8;
  TPZGraphMesh *in_stack_ffffffffffffffc0;
  
  pTVar3 = TPZCompEl::Reference(in_stack_ffffffffffffffb8);
  if (pTVar3 == (TPZGeoEl *)0x0) {
    return;
  }
  plVar4 = (long *)(**(code **)(*in_RDI + 0xb8))();
  (**(code **)(*plVar4 + 0x58))();
  iVar2 = NSides(in_stack_ffffffffffffffa8);
  bVar1 = TPZGraphMesh::Material_Is_PostProcessed
                    (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if ((in_EDX == 2) && (bVar1)) {
    if (iVar2 == 9) {
      this_00 = (TPZGraphElQ2dd *)operator_new(0x28);
      TPZGraphElQ2dd::TPZGraphElQ2dd(this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      return;
    }
    if (iVar2 == 7) {
      c = (TPZCompEl *)operator_new(0x28);
      TPZGraphElTd::TPZGraphElTd
                ((TPZGraphElTd *)in_stack_ffffffffffffffc0,c,in_stack_ffffffffffffffb0);
      return;
    }
  }
  if ((in_EDX == 3) && (bVar1)) {
    in_stack_ffffffffffffffb0 = (TPZGraphMesh *)operator_new(0x28);
    TPZGraphElQ3dd::TPZGraphElQ3dd
              ((TPZGraphElQ3dd *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  }
  if ((in_EDX == 1) && (bVar1)) {
    operator_new(0x28);
    TPZGraphEl1dd::TPZGraphEl1dd
              ((TPZGraphEl1dd *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void TPZAgglomerateElement::CreateGraphicalElement(TPZGraphMesh &grmesh, int dimension) {
	if(!Reference()) return;
	int matid = Material()->Id();
	int nsides = NSides();
    bool to_postpro = grmesh.Material_Is_PostProcessed(matid);
	if(dimension == 2 && to_postpro){
		if(nsides == 9){
			new TPZGraphElQ2dd(this,&grmesh);
			return;
		}
		if(nsides == 7){
			new TPZGraphElTd(this,&grmesh);
			return;
		}
	}
	if(dimension == 3 && to_postpro){
		new TPZGraphElQ3dd(this,&grmesh);
	}
	if(dimension == 1 && to_postpro){
		new TPZGraphEl1dd(this,&grmesh);
	}
}